

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainter.h
# Opt level: O0

void __thiscall QPainter::fillRect(QPainter *this,int x,int y,int w,int h,GlobalColor c)

{
  QRect *in_RDI;
  GlobalColor in_R9D;
  long in_FS_OFFSET;
  int in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  QRect *this_00;
  QRect local_28;
  QColor local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &local_28;
  QRect::QRect(this_00,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,in_stack_ffffffffffffff9c,
               in_stack_ffffffffffffff98);
  QColor::QColor(&local_18,in_R9D);
  QPainter::fillRect(in_RDI,(QColor *)this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

inline void QPainter::fillRect(int x, int y, int w, int h, Qt::GlobalColor c)
{
    fillRect(QRect(x, y, w, h), QColor(c));
}